

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O2

void Map_TimeComputeRequiredGlobal(Map_Man_t *p)

{
  float fVar1;
  uint uVar2;
  Map_NodeVec_t *pMVar3;
  Map_Node_t *pMVar4;
  Scl_Con_t *pSVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  
  bVar14 = false;
  pSVar5 = Scl_ConReadMan();
  if (pSVar5 != (Scl_Con_t *)0x0) {
    pSVar5 = Scl_ConReadMan();
    uVar2 = (pSVar5->vOutReqs).nSize;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    uVar10 = 0;
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      uVar10 = uVar10 + ((pSVar5->vOutReqs).pArray[uVar9] == 0);
    }
    bVar14 = uVar10 != uVar2;
  }
  fVar15 = Map_TimeComputeArrivalMax(p);
  p->fRequiredGlo = fVar15;
  fVar16 = p->DelayTarget;
  if ((fVar16 != -1.0) || (NAN(fVar16))) {
    if (fVar15 <= fVar16 + p->fEpsilon) {
      if (fVar15 < fVar16 - p->fEpsilon) {
        if ((p->fMappingMode == 1) && (p->fVerbose != 0)) {
          printf("Relaxing the required times from (%4.2f) to the target (%4.2f).\n",
                 SUB84((double)fVar15,0),(double)fVar16);
          fVar16 = p->DelayTarget;
        }
        p->fRequiredGlo = fVar16;
      }
    }
    else if (p->fMappingMode == 1) {
      printf("Cannot meet the target required times (%4.2f). Continue anyway.\n",
             SUB84((double)fVar16,0));
    }
  }
  pMVar3 = p->vMapObjs;
  uVar2 = pMVar3->nSize;
  uVar9 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pMVar4 = pMVar3->pArray[uVar9];
    pMVar4->tRequired[0].Rise = 3.4028235e+37;
    pMVar4->tRequired[0].Fall = 3.4028235e+37;
    *(undefined8 *)&pMVar4->tRequired[0].Worst = 0x7dcccccc7dcccccc;
    pMVar4->tRequired[1].Fall = 3.4028235e+37;
    pMVar4->tRequired[1].Worst = 3.4028235e+37;
  }
  lVar13 = 4;
  lVar11 = 0;
  do {
    if (p->nOutputs <= lVar11) {
      Map_TimePropagateRequired(p);
      return;
    }
    uVar7 = (ulong)p->pOutputs[lVar11] & 0xfffffffffffffffe;
    lVar8 = (ulong)(~(uint)p->pOutputs[lVar11] & 1) * 0xc;
    lVar12 = lVar8 + 0x60 + uVar7;
    if (bVar14) {
      pSVar5 = Scl_ConReadMan();
      if ((pSVar5->vOutReqs).nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      fVar16 = (float)(pSVar5->vOutReqs).pArray[lVar11] / 1000.0;
      if ((fVar16 <= 0.0) ||
         ((fVar1 = *(float *)(lVar12 + 8), fVar15 = fVar16, fVar16 < fVar1 &&
          (fVar15 = fVar1, fVar1 <= fVar16)))) {
LAB_00368f4b:
        fVar15 = p->fRequiredGlo;
      }
    }
    else if (((p->pOutputRequireds == (Map_Time_t *)0x0) ||
             (fVar16 = *(float *)((long)&p->pOutputRequireds->Rise + lVar13 * 2), fVar16 <= 0.0)) ||
            ((fVar15 = fVar16, fVar16 < *(float *)(lVar12 + 8) &&
             (fVar15 = *(float *)(lVar12 + 8), *(float *)(lVar12 + 8) <= fVar16))))
    goto LAB_00368f4b;
    pfVar6 = (float *)(lVar8 + 0x78 + uVar7);
    pfVar6[2] = fVar15;
    pfVar6[1] = fVar15;
    *pfVar6 = fVar15;
    lVar11 = lVar11 + 1;
    lVar13 = lVar13 + 6;
  } while( true );
}

Assistant:

void Map_TimeComputeRequiredGlobal( Map_Man_t * p )
{
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    Map_Time_t * ptTime, * ptTimeA;
    int fPhase, i; 
    // update the required times according to the target
    p->fRequiredGlo = Map_TimeComputeArrivalMax( p );
    if ( p->DelayTarget != -1 )
    {
        if ( p->fRequiredGlo > p->DelayTarget + p->fEpsilon )
        {
            if ( p->fMappingMode == 1 )
                printf( "Cannot meet the target required times (%4.2f). Continue anyway.\n", p->DelayTarget );
        }
        else if ( p->fRequiredGlo < p->DelayTarget - p->fEpsilon )
        {
            if ( p->fMappingMode == 1 && p->fVerbose )
                printf( "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->fRequiredGlo, p->DelayTarget );
            p->fRequiredGlo = p->DelayTarget;
        }
    }
    // clean the required times
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        p->vMapObjs->pArray[i]->tRequired[0].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Worst = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Worst = MAP_FLOAT_LARGE;
    }
    // set the required times for the POs
    for ( i = 0; i < p->nOutputs; i++ )
    {
        fPhase  = !Map_IsComplement(p->pOutputs[i]);
        ptTime  =  Map_Regular(p->pOutputs[i])->tRequired + fPhase;
        ptTimeA =  Map_Regular(p->pOutputs[i])->tArrival + fPhase;

        if ( fUseConMan )
        {
            float Value = Scl_ConGetOutReqFloat(i);
            // if external required time can be achieved, use it
            if ( Value > 0 && ptTimeA->Worst <= Value )//&& Value <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = Value;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( Value > 0 && ptTimeA->Worst > Value )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
        else
        {
            // if external required time can be achieved, use it
            if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst <= p->pOutputRequireds[i].Worst )//&& p->pOutputRequireds[i].Worst <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->pOutputRequireds[i].Worst;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst > p->pOutputRequireds[i].Worst )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
    }
    // visit nodes in the reverse topological order
    Map_TimePropagateRequired( p );
}